

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.h
# Opt level: O2

CharGroup_ * __thiscall
kj::parse::CharGroup_::orAny(CharGroup_ *__return_storage_ptr__,CharGroup_ *this,char *chars)

{
  Bits64 BVar1;
  Bits64 BVar2;
  Bits64 BVar3;
  CharGroup_ CStack_38;
  
  if (*chars == '\0') {
    BVar1 = this->bits[0];
    BVar2 = this->bits[1];
    BVar3 = this->bits[3];
    __return_storage_ptr__->bits[2] = this->bits[2];
    __return_storage_ptr__->bits[3] = BVar3;
    __return_storage_ptr__->bits[0] = BVar1;
    __return_storage_ptr__->bits[1] = BVar2;
  }
  else {
    orChar(&CStack_38,this,*chars);
    orAny(__return_storage_ptr__,&CStack_38,chars + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr inline CharGroup_ orAny(const char* chars) const {
    return *chars == 0 ? *this : orChar(*chars).orAny(chars + 1);
  }